

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpAddress.cpp
# Opt level: O3

void getBoardcastIP(char *addressBuffer)

{
  ifaddrs *ifAddrStruct;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)0x0;
  getifaddrs(&local_18);
  for (; local_18 != (undefined8 *)0x0; local_18 = (undefined8 *)*local_18) {
    if (*(short *)local_18[3] == 2) {
      inet_ntop(2,(void *)(local_18[5] + 4),addressBuffer,0x10);
    }
  }
  return;
}

Assistant:

void getBoardcastIP(char* addressBuffer) {
    struct ifaddrs * ifAddrStruct=NULL;
    void * tmpAddrPtr=NULL;
    getifaddrs(&ifAddrStruct);
    while (ifAddrStruct!=NULL) {
        if (ifAddrStruct->ifa_addr->sa_family==AF_INET) { // check it is IP4
            tmpAddrPtr=&((struct sockaddr_in *)ifAddrStruct->ifa_ifu.ifu_broadaddr)->sin_addr;
            inet_ntop(AF_INET, tmpAddrPtr, addressBuffer, INET_ADDRSTRLEN);
        }
        ifAddrStruct=ifAddrStruct->ifa_next;
    }
//    cout << addressBuffer << endl;
}